

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall hdc::Driver::callCppCompiler(Driver *this)

{
  ostream *poVar1;
  char *__command;
  string local_1c8 [48];
  stringstream local_198 [8];
  stringstream s;
  ostream local_188 [376];
  Driver *local_10;
  Driver *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"g++ gen.cpp -fpermissive -o ");
  std::operator<<(poVar1,(string *)&this->outputName);
  std::__cxx11::stringstream::str();
  __command = (char *)std::__cxx11::string::c_str();
  system(__command);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void Driver::callCppCompiler() {
    std::stringstream s;

    s << "g++ gen.cpp -fpermissive -o " << outputName;
    system(s.str().c_str());
}